

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5HeapArgumentsObject::GetItemAt
          (ES5HeapArgumentsObject *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  BVSparse<Memory::Recycler> *this_00;
  BOOLEAN BVar1;
  PropertyQueryFlags PVar2;
  BOOL BVar3;
  ScriptContext *requestContext_00;
  
  this_00 = (this->super_HeapArgumentsObject).deletedArgs.ptr;
  requestContext_00 = requestContext;
  if (this_00 != (BVSparse<Memory::Recycler> *)0x0) {
    BVar1 = BVSparse<Memory::Recycler>::Test(this_00,index);
    if (BVar1 != '\0') {
      PVar2 = DynamicObject::GetItemQuery((DynamicObject *)this,this,index,value,requestContext);
      return (BOOL)(PVar2 == Property_Found);
    }
  }
  BVar3 = HeapArgumentsObject::GetItemAt
                    (&this->super_HeapArgumentsObject,index,value,requestContext_00);
  return BVar3;
}

Assistant:

BOOL ES5HeapArgumentsObject::GetItemAt(uint32 index, Var* value, ScriptContext* requestContext)
    {
        return this->IsFormalDisconnectedFromNamedArgument(index) ?
            JavascriptConversion::PropertyQueryFlagsToBoolean(this->DynamicObject::GetItemQuery(this, index, value, requestContext)) :
            __super::GetItemAt(index, value, requestContext);
    }